

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decUtil.c
# Opt level: O3

DdNode * Dec_GraphDeriveBdd(DdManager *dd,Dec_Graph_t *pGraph)

{
  uint uVar1;
  Dec_Node_t *pDVar2;
  int iVar3;
  DdNode *pDVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  long lVar10;
  
  uVar1 = pGraph->nLeaves;
  if ((int)uVar1 < 0) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/dec/decUtil.c"
                  ,0x39,"DdNode *Dec_GraphDeriveBdd(DdManager *, Dec_Graph_t *)");
  }
  iVar3 = pGraph->nSize;
  if ((int)uVar1 <= iVar3) {
    if (pGraph->fConst == 0) {
      uVar6 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
      if (uVar6 < uVar1) {
        pDVar4 = Cudd_bddIthVar(dd,uVar6);
      }
      else {
        if (uVar1 == 0) {
          puVar9 = (undefined1 *)0x0;
          iVar5 = 0;
        }
        else {
          lVar10 = 0;
          lVar8 = -0x18;
          do {
            lVar7 = lVar8;
            pDVar2 = pGraph->pNodes;
            pDVar4 = Cudd_bddIthVar(dd,(int)lVar10);
            *(DdNode **)((long)&pDVar2[1].field_2 + lVar7) = pDVar4;
            lVar10 = lVar10 + 1;
            iVar5 = pGraph->nLeaves;
            lVar8 = lVar7 + 0x18;
          } while (lVar10 < iVar5);
          iVar3 = pGraph->nSize;
          puVar9 = &pDVar2[1].eEdge0.field_0x0 + lVar7;
        }
        if (iVar5 < iVar3) {
          lVar10 = (long)iVar5;
          lVar8 = lVar10 * 0x18 + -0x18;
          do {
            lVar7 = lVar8;
            pDVar2 = pGraph->pNodes;
            uVar1 = *(uint *)(&pDVar2[1].eEdge0.field_0x0 + lVar7);
            uVar6 = *(uint *)(&pDVar2[1].eEdge1.field_0x0 + lVar7);
            pDVar4 = Cudd_bddAnd(dd,(DdNode *)
                                    ((ulong)(uVar1 & 1) ^
                                    (ulong)pDVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc),
                                 (DdNode *)
                                 ((ulong)(uVar6 & 1) ^
                                 (ulong)pDVar2[uVar6 >> 1 & 0x3fffffff].field_2.pFunc));
            *(DdNode **)((long)&pDVar2[1].field_2 + lVar7) = pDVar4;
            Cudd_Ref(pDVar4);
            lVar10 = lVar10 + 1;
            lVar8 = lVar7 + 0x18;
          } while (lVar10 < pGraph->nSize);
          puVar9 = &pDVar2[1].eEdge0.field_0x0 + lVar7;
        }
        pDVar4 = *(DdNode **)(puVar9 + 8);
        Cudd_Ref(pDVar4);
        lVar8 = (long)pGraph->nLeaves;
        if (pGraph->nLeaves < pGraph->nSize) {
          lVar10 = lVar8 * 0x18 + 8;
          do {
            Cudd_RecursiveDeref(dd,*(DdNode **)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar10));
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + 0x18;
          } while (lVar8 < pGraph->nSize);
        }
        Cudd_Deref(pDVar4);
      }
    }
    else {
      pDVar4 = dd->one;
    }
    return (DdNode *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pDVar4);
  }
  __assert_fail("Dec_GraphLeaveNum(pGraph) <= pGraph->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/dec/decUtil.c"
                ,0x3a,"DdNode *Dec_GraphDeriveBdd(DdManager *, Dec_Graph_t *)");
}

Assistant:

DdNode * Dec_GraphDeriveBdd( DdManager * dd, Dec_Graph_t * pGraph )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;

    // sanity checks
    assert( Dec_GraphLeaveNum(pGraph) >= 0 );
    assert( Dec_GraphLeaveNum(pGraph) <= pGraph->nSize );

    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Cudd_NotCond( b1, Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Cudd_NotCond( Cudd_bddIthVar(dd, Dec_GraphVarInt(pGraph)), Dec_GraphIsComplement(pGraph) );

    // assign the elementary variables
    Dec_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Cudd_bddIthVar( dd, i );

    // compute the function for each internal node
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        bFunc1 = Cudd_NotCond( Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( (DdNode *)pNode->pFunc );
    }

    // deref the intermediate results
    bFunc = (DdNode *)pNode->pFunc;   Cudd_Ref( bFunc );
    Dec_GraphForEachNode( pGraph, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pFunc );
    Cudd_Deref( bFunc );

    // complement the result if necessary
    return Cudd_NotCond( bFunc, Dec_GraphIsComplement(pGraph) );
}